

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex7.cpp
# Opt level: O2

char * cat_dot(char *s1,char *s2,char *delim)

{
  char cVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  
  uVar2 = str_len(s1);
  uVar3 = str_len(s2);
  uVar4 = str_len(delim);
  pcVar5 = (char *)operator_new__((ulong)(uVar4 + uVar3 + uVar2 + 1));
  pcVar6 = pcVar5;
  for (; (s1 != (char *)0x0 && (*s1 != '\0')); s1 = s1 + 1) {
    *pcVar6 = *s1;
    pcVar6 = pcVar6 + 1;
  }
  for (; (delim != (char *)0x0 && (*delim != '\0')); delim = delim + 1) {
    *pcVar6 = *delim;
    pcVar6 = pcVar6 + 1;
  }
  for (lVar7 = 0; (s2 + lVar7 != (char *)0x0 && (cVar1 = s2[lVar7], cVar1 != '\0'));
      lVar7 = lVar7 + 1) {
    pcVar6[lVar7] = cVar1;
  }
  pcVar6[lVar7] = '\0';
  return pcVar5;
}

Assistant:

char* cat_dot(const char* s1, const char* s2, const char* delim)
{
	uint32_t size = str_len(s1) + str_len(s2) + str_len(delim) + 1;
	char* str = new char[size];
	char* begin = str;
	uint32_t cnt = 0;
	while (s1 && *s1)
	{
		*str++ = *s1++;
	}

	while (delim && *delim)
	{
		*str++ = *delim++;
	}

	while (s2 && *s2)
	{
		*str++ = *s2++;
	}
	*str = '\0';
	return begin;
}